

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderFramebufferTextureInvalidTarget::iterate
          (GeometryShaderFramebufferTextureInvalidTarget *this)

{
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_1c8;
  int local_44;
  long lStack_40;
  GLuint errorEnum;
  Functions *gl;
  GLubyte pixels [16];
  bool result;
  GeometryShaderFramebufferTextureInvalidTarget *this_local;
  
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
    gl = (Functions *)0x101010101010101;
    builtin_memcpy(pixels,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar1 = (*pRVar3->_vptr_RenderContext[3])();
    lStack_40 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lStack_40 + 0x6f8))(1,&this->m_to_id);
    dVar2 = (**(code **)(lStack_40 + 0x800))();
    glu::checkError(dVar2,"glGenTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                    ,0x260);
    (**(code **)(lStack_40 + 0xb8))(0xde1,this->m_to_id);
    dVar2 = (**(code **)(lStack_40 + 0x800))();
    glu::checkError(dVar2,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                    ,0x263);
    (**(code **)(lStack_40 + 0x1310))(0xde1,0,0x1908,2,2,0,0x1908,0x1401,&gl);
    dVar2 = (**(code **)(lStack_40 + 0x800))();
    glu::checkError(dVar2,"glTexImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                    ,0x267);
    (**(code **)(lStack_40 + 0x710))(0xde1);
    dVar2 = (**(code **)(lStack_40 + 0x800))();
    glu::checkError(dVar2,"glGenerateMipmap() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                    ,0x26a);
    (**(code **)(lStack_40 + 0x6d0))(1,&this->m_fbo_id);
    dVar2 = (**(code **)(lStack_40 + 0x800))();
    glu::checkError(dVar2,"glGenFramebuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                    ,0x26d);
    (**(code **)(lStack_40 + 0x78))(0x8ca9,this->m_fbo_id);
    dVar2 = (**(code **)(lStack_40 + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer() call failed with GL_DRAW_FRAMEBUFFER pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                    ,0x270);
    (**(code **)(lStack_40 + 0x690))(0x806f,0x8ce0,this->m_to_id,1);
    local_44 = (**(code **)(lStack_40 + 0x800))();
    if (local_44 == 0x500) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      this_02 = tcu::MessageBuilder::operator<<
                          (&local_1c8,
                           (char (*) [52])"Error different than GL_INVALID_ENUM was generated.");
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
             ,600);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderFramebufferTextureInvalidTarget::iterate()
{
	bool result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::GLubyte pixels[] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1 };

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA, 2 /* width */, 2 /* height */, 0 /* border */, GL_RGBA,
				  GL_UNSIGNED_BYTE, pixels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D() call failed.");

	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap() call failed.");

	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed with GL_DRAW_FRAMEBUFFER pname.");

	glw::GLuint errorEnum;

	gl.framebufferTexture(GL_TEXTURE_3D, GL_COLOR_ATTACHMENT0, m_to_id /* texture */, 1 /* level */);
	errorEnum = gl.getError();

	if (errorEnum != GL_INVALID_ENUM)
	{
		result = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Error different than GL_INVALID_ENUM was generated."
						   << tcu::TestLog::EndMessage;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}